

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_list.cpp
# Opt level: O2

ColumnList * __thiscall
duckdb::ColumnList::Copy(ColumnList *__return_storage_ptr__,ColumnList *this)

{
  pointer pCVar1;
  pointer this_00;
  ColumnDefinition CStack_f8;
  
  ColumnList(__return_storage_ptr__,this->allow_duplicate_names);
  pCVar1 = (this->columns).
           super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->columns).
                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1
      ) {
    ColumnDefinition::Copy(&CStack_f8,this_00);
    AddColumn(__return_storage_ptr__,&CStack_f8);
    ColumnDefinition::~ColumnDefinition(&CStack_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

ColumnList ColumnList::Copy() const {
	ColumnList result(allow_duplicate_names);
	for (auto &col : columns) {
		result.AddColumn(col.Copy());
	}
	return result;
}